

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

size_t enet_list_size(ENetList *list)

{
  _ENetListNode *local_20;
  ENetListIterator position;
  size_t size;
  ENetList *list_local;
  
  position = (ENetListIterator)0x0;
  for (local_20 = (list->sentinel).next; local_20 != &list->sentinel;
      local_20 = ((ENetListNode *)&local_20->next)->next) {
    position = (ENetListIterator)((long)&position->next + 1);
  }
  return (size_t)position;
}

Assistant:

size_t
enet_list_size (ENetList * list)
{
   size_t size = 0;
   ENetListIterator position;

   for (position = enet_list_begin (list);
        position != enet_list_end (list);
        position = enet_list_next (position))
     ++ size;
   
   return size;
}